

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

string * PrintColumn_abi_cxx11_
                   (string *__return_storage_ptr__,double x,size_t decDigits,size_t width)

{
  long lVar1;
  char cVar2;
  stringstream ss;
  double local_1b8;
  long local_1b0;
  size_t sStack_1a8;
  size_t local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [96];
  char acStack_d0 [168];
  
  local_1b8 = x;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) & 0xfffffefb | 4;
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) & 0xffffff4f | 0x80;
  lVar1 = *(long *)(local_1b0 + -0x18);
  if (acStack_d0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)&local_1b8 + (char)lVar1 + '\b');
    acStack_d0[lVar1] = cVar2;
    acStack_d0[lVar1 + 1] = '\x01';
  }
  acStack_d0[lVar1] = ' ';
  *(size_t *)((long)local_1a0 + *(long *)(local_1b0 + -0x18)) = width;
  *(size_t *)((long)&sStack_1a8 + *(long *)(local_1b0 + -0x18)) = decDigits;
  std::ostream::_M_insert<double>(local_1b8);
  celero::console::SetConsoleColor(Default);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," | ",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintColumn(const double x, const size_t decDigits = PrintConstants::DoubleDecimals, const size_t width = PrintConstants::ColumnWidth)
{
	std::stringstream ss;
	ss << std::fixed << std::right;

	// fill space around displayed #
	ss.fill(' ');

	// set  width around displayed #
	ss.width(width);

	// set # places after decimal
	ss.precision(decDigits);
	ss << x;

	celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
	ss << " | ";
	return ss.str();
}